

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

size_t format(char *dst,size_t size,char *src,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t local_108;
  size_t local_100;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_38;
  int result;
  va_list args;
  char *src_local;
  size_t size_local;
  char *dst_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  result = 0x30;
  local_38 = 0x18;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  args[0].reg_save_area = src;
  uVar1 = vsnprintf(dst,size,src,&local_38);
  dst[size - 1] = '\0';
  if (uVar1 == 0xffffffff) {
    local_100 = 0;
  }
  else {
    local_108 = size;
    if (uVar1 <= size) {
      local_108 = (size_t)(int)uVar1;
    }
    local_100 = local_108;
  }
  return local_100;
}

Assistant:

size_t format(char* dst, size_t size, const char* src, ...)
{
	va_list args;
	va_start(args, src);

	int result = vsnprintf(dst, size, src, args);
	dst[size - 1] = '\0';

	va_end(args);

	return result == -1 ? 0 : (unsigned(result) > size ? size : result);
}